

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysex.c
# Opt level: O2

void receive_poll(PtTimestamp timestamp,void *userData)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  char *__s;
  uchar *puVar7;
  uint uVar8;
  PmEvent event;
  
  if (receive_poll_running != '\x01') {
    return;
  }
  uVar8 = 0;
  __s = "error: incoming sysex too long";
  while (uVar8 != 0xf7) {
    iVar4 = Pm_Read(receive_msg_midi_in,&event,1);
    if (iVar4 == 0) {
      return;
    }
    lVar5 = (long)receive_msg_index;
    uVar6 = 0;
    iVar4 = receive_msg_index;
    for (; (iVar4 = iVar4 + 1, uVar6 < 0x20 && (uVar8 != 0xf7)); uVar8 = uVar8 & 0xff) {
      uVar8 = event.message >> ((byte)uVar6 & 0x1f);
      receive_msg_index = iVar4;
      receive_msg[lVar5] = (uchar)uVar8;
      if (0x3fe < lVar5) goto LAB_00103c35;
      uVar6 = uVar6 + 8;
      lVar5 = lVar5 + 1;
    }
  }
  if (receive_msg_length == 0) {
    receive_msg_length = receive_msg_index;
  }
  else if (receive_msg_length != receive_msg_index) {
    __s = "error: incoming sysex wrong length";
    goto LAB_00103c35;
  }
  if (receive_msg[0] == 0xf0) {
    puVar7 = receive_msg;
    iVar4 = 0;
    for (lVar5 = 0; puVar7 = puVar7 + 1, lVar5 != 0x23; lVar5 = lVar5 + 7) {
      iVar4 = iVar4 + ((uint)*puVar7 << ((byte)lVar5 & 0x1f));
    }
    iVar2 = iVar4;
    iVar3 = iVar4;
    if ((receive_msg_count == -1) ||
       (iVar2 = receive_msg_count, iVar3 = receive_msg_messages, receive_msg_count == iVar4)) {
      receive_msg_messages = iVar3;
      receive_msg_count = iVar2;
      lVar5 = 6;
      __s = "error: incoming sysex has bad data";
      do {
        if ((long)receive_msg_index + -1 <= lVar5) {
          if (*(char *)((long)&receive_msg_midi_in + (long)receive_msg_index + 7) != -9) {
            receive_msg_error = 1;
            return;
          }
          receive_msg_index = 0;
          receive_msg_count = iVar4 + -1;
          return;
        }
        pbVar1 = receive_msg + lVar5;
        uVar8 = (uint)lVar5;
        lVar5 = lVar5 + 1;
      } while ((uVar8 & 0x7f) == (uint)*pbVar1);
    }
    else {
      __s = "error: incoming sysex has wrong count";
    }
  }
  else {
    __s = "error: incoming sysex missing status byte";
  }
LAB_00103c35:
  puts(__s);
  receive_msg_error = 1;
  return;
}

Assistant:

void receive_poll(PtTimestamp timestamp, void *userData)
{
    PmError count;
    PmEvent event;
    int shift;
    int data = 0;
    int i;
    
    if (!receive_poll_running) return; /* wait until midi device is opened */
    shift = 0;
    while (data != MIDI_EOX) {
        count = Pm_Read(receive_msg_midi_in, &event, 1);
        if (count == 0) return;

        /* compare 4 bytes of data until you reach an eox */
        for (shift = 0; shift < 32 && (data != MIDI_EOX); shift += 8) {
            receive_msg[receive_msg_index++] = data = 
                (event.message >> shift) & 0xFF;
            if (receive_msg_index >= MAX_MSG_LEN) {
                printf("error: incoming sysex too long\n");
                goto error;
            }
        }
    }
    /* check the message */
    if (receive_msg_length == 0) {
        receive_msg_length = receive_msg_index;
    }
    if (receive_msg_length != receive_msg_index) {
        printf("error: incoming sysex wrong length\n");
        goto error;
    }
    if (receive_msg[0] != MIDI_SYSEX) {
        printf("error: incoming sysex missing status byte\n");
        goto error;
    }
    /* get and check the count */
    count = 0;
    for (i = 0; i < 5; i++) {
        count += receive_msg[i + 1] << (7 * i);
    }
    if (receive_msg_count == -1) {
        receive_msg_count = count;
        receive_msg_messages = count;
    }
    if (receive_msg_count != count) {
        printf("error: incoming sysex has wrong count\n");
        goto error;
    }
    for (i = 6; i < receive_msg_index - 1; i++) {
        if (receive_msg[i] != i % 128) {
            printf("error: incoming sysex has bad data\n");
            goto error;
        }
    }
    if (receive_msg[receive_msg_length - 1] != MIDI_EOX) goto error;
    receive_msg_index = 0; /* get ready for next message */
    receive_msg_count--;
    return;
 error:
    receive_msg_error = 1;
    return;
}